

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * Json::duplicateAndPrefixStringValue(char *value,uint length)

{
  uint in_ESI;
  void *in_RDI;
  char *newString;
  uint actualLength;
  ostringstream oss;
  string *in_stack_fffffffffffffe10;
  string local_1e8 [32];
  uint *local_1c8;
  uint local_1bc;
  string local_1b8 [48];
  ostringstream local_188 [380];
  uint local_c;
  void *local_8;
  
  if (0x7ffffffa < in_ESI) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,
                    "in Json::Value::duplicateAndPrefixStringValue(): length too big for prefixing")
    ;
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_1b8);
    abort();
  }
  local_1bc = in_ESI + 5;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_1c8 = (uint *)malloc((ulong)local_1bc);
  if (local_1c8 == (uint *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1e8,
               "in Json::Value::duplicateAndPrefixStringValue(): Failed to allocate string value buffer"
               ,(allocator *)&stack0xfffffffffffffe17);
    throwRuntimeError(in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
  }
  *local_1c8 = local_c;
  memcpy(local_1c8 + 1,local_8,(ulong)local_c);
  *(char *)((long)local_1c8 + (ulong)(local_1bc - 1)) = '\0';
  return (char *)local_1c8;
}

Assistant:

static inline char* duplicateAndPrefixStringValue(
    const char* value,
    unsigned int length)
{
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  JSON_ASSERT_MESSAGE(length <= (unsigned)Value::maxInt - sizeof(unsigned) - 1U,
                      "in Json::Value::duplicateAndPrefixStringValue(): "
                      "length too big for prefixing");
  unsigned actualLength = length + sizeof(unsigned) + 1U;
  char* newString = static_cast<char*>(malloc(actualLength));
  if (newString == 0) {
    throwRuntimeError(
        "in Json::Value::duplicateAndPrefixStringValue(): "
        "Failed to allocate string value buffer");
  }
  *reinterpret_cast<unsigned*>(newString) = length;
  memcpy(newString + sizeof(unsigned), value, length);
  newString[actualLength - 1U] = 0; // to avoid buffer over-run accidents by users later
  return newString;
}